

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O0

BitState __thiscall I2sSimulationDataGenerator::GetNextAudioBit(I2sSimulationDataGenerator *this)

{
  ulong uVar1;
  S64 SVar2;
  reference pvVar3;
  BitState local_1c;
  BitState bit_state;
  I2sSimulationDataGenerator *this_local;
  
  switch(this->mBitGenerationState) {
  case Init:
    if (this->mSettings->mBitAlignment == BITS_SHIFTED_RIGHT_1) {
      this->mBitGenerationState = LeftPadding;
      this_local._4_4_ = BIT_LOW;
    }
    else {
      this->mBitGenerationState = LeftPadding;
      this_local._4_4_ = GetNextAudioBit(this);
    }
    break;
  case LeftPadding:
    if (this->mSettings->mWordAlignment == RIGHT_ALIGNED) {
      if (this->mPaddingCount < this->mNumPaddingBits) {
        this->mPaddingCount = this->mPaddingCount + 1;
        this_local._4_4_ = BIT_LOW;
      }
      else {
        this->mBitGenerationState = Data;
        this->mPaddingCount = 0;
        this_local._4_4_ = GetNextAudioBit(this);
      }
    }
    else {
      this->mBitGenerationState = Data;
      this_local._4_4_ = GetNextAudioBit(this);
    }
    break;
  case Data:
    if (this->mCurrentBitIndex == this->mSettings->mBitsPerWord) {
      this->mCurrentBitIndex = 0;
      SVar2 = GetNextAudioWord(this);
      this->mCurrentWord = SVar2;
      this->mBitGenerationState = RightPadding;
      this_local._4_4_ = GetNextAudioBit(this);
    }
    else {
      uVar1 = this->mCurrentWord;
      pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (&this->mBitMasks,(ulong)this->mCurrentBitIndex);
      local_1c = (BitState)((uVar1 & *pvVar3) != 0);
      this->mCurrentBitIndex = this->mCurrentBitIndex + 1;
      this_local._4_4_ = local_1c;
    }
    break;
  case RightPadding:
    if (this->mSettings->mWordAlignment == LEFT_ALIGNED) {
      if (this->mPaddingCount < this->mNumPaddingBits) {
        this->mPaddingCount = this->mPaddingCount + 1;
        this_local._4_4_ = BIT_LOW;
      }
      else {
        this->mBitGenerationState = Data;
        this->mPaddingCount = 0;
        this_local._4_4_ = GetNextAudioBit(this);
      }
    }
    else {
      this->mBitGenerationState = LeftPadding;
      this_local._4_4_ = GetNextAudioBit(this);
    }
    break;
  default:
    AnalyzerHelpers::Assert("unexpected");
    this_local._4_4_ = BIT_LOW;
  }
  return this_local._4_4_;
}

Assistant:

BitState I2sSimulationDataGenerator::GetNextAudioBit()
{
    switch( mBitGenerationState )
    {
    case Init:
        if( mSettings->mBitAlignment == BITS_SHIFTED_RIGHT_1 )
        {
            mBitGenerationState = LeftPadding;
            return BIT_LOW; // just once, we'll insert a 1-bit offset.
        }
        else
        {
            mBitGenerationState = LeftPadding;
            return GetNextAudioBit();
        }
        break;
    case LeftPadding:
        if( mSettings->mWordAlignment == RIGHT_ALIGNED )
        {
            if( mPaddingCount < mNumPaddingBits )
            {
                mPaddingCount++;
                return BIT_LOW;
            }
            else
            {
                mBitGenerationState = Data;
                mPaddingCount = 0;
                return GetNextAudioBit();
            }
        }
        else
        {
            mBitGenerationState = Data;
            return GetNextAudioBit();
        }
        break;
    case Data:
        if( mCurrentBitIndex == mSettings->mBitsPerWord )
        {
            mCurrentBitIndex = 0;
            mCurrentWord = GetNextAudioWord();
            mBitGenerationState = RightPadding;
            return GetNextAudioBit();
        }
        else
        {
            BitState bit_state;

            if( ( mCurrentWord & mBitMasks[ mCurrentBitIndex ] ) == 0 )
                bit_state = BIT_LOW;
            else
                bit_state = BIT_HIGH;

            mCurrentBitIndex++;
            return bit_state;
        }
        break;
    case RightPadding:
        if( mSettings->mWordAlignment == LEFT_ALIGNED )
        {
            if( mPaddingCount < mNumPaddingBits )
            {
                mPaddingCount++;
                return BIT_LOW;
            }
            else
            {
                mBitGenerationState = Data;
                mPaddingCount = 0;
                return GetNextAudioBit();
            }
        }
        else
        {
            mBitGenerationState = LeftPadding;
            return GetNextAudioBit();
        }
        break;
    default:
        AnalyzerHelpers::Assert( "unexpected" );
        return BIT_LOW; // eliminate warning
        break;
    }
}